

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

void __thiscall LinkedToken::~LinkedToken(LinkedToken *this)

{
  LinkedToken *this_local;
  
  std::__cxx11::string::~string((string *)&this->link);
  Token::~Token(&this->token);
  return;
}

Assistant:

LinkedToken(Token _token, std::string url) :
            token(std::move(_token)),
            link(std::move(url)) {
    }